

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonRewrite.c
# Opt level: O0

_Bool ParseCommandLineBoolArg(int *pArgC,char ***pArgV,char *String1,char *String2)

{
  int iVar1;
  int local_34;
  int local_30;
  int x;
  int i;
  _Bool itemExists;
  char *String2_local;
  char *String1_local;
  char ***pArgV_local;
  int *pArgC_local;
  
  x._3_1_ = false;
  local_30 = 0;
  do {
    if (*pArgC <= local_30) {
      return x._3_1_;
    }
    iVar1 = strcasecmp(String1,(*pArgV)[local_30]);
    if (iVar1 == 0) {
LAB_001015fc:
      x._3_1_ = true;
      for (local_34 = local_30; local_34 < *pArgC + -1; local_34 = local_34 + 1) {
        (*pArgV)[local_34] = (*pArgV)[local_34 + 1];
      }
      *pArgC = *pArgC + -1;
    }
    else {
      iVar1 = strcasecmp(String2,(*pArgV)[local_30]);
      if (iVar1 == 0) goto LAB_001015fc;
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

static
bool
    ParseCommandLineBoolArg
    (
        int*        pArgC,      // [in,out]
        char***     pArgV,      // [in,out]
        char const* String1,    // [in]
        char const* String2     // [in]
    )
{
    bool itemExists = false;

    for( int i=0; i<*pArgC; i++ )
    {
        if(     strcasecmp( String1, (*pArgV)[i] ) == 0
            ||  strcasecmp( String2, (*pArgV)[i] ) == 0 )
        {
            itemExists = true;
            // ripple down remaining items
            for( int x=i; x<(*pArgC)-1; x++ )
            {
                (*pArgV)[x] = (*pArgV)[x+1];
            }
            *pArgC -= 1;
        }
    }

    return itemExists;
}